

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int header_get_durable(HEADER_HANDLE header,_Bool *durable_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  uint32_t local_14;
  
  local_14 = (uint32_t)((ulong)in_RAX >> 0x20);
  if (header == (HEADER_HANDLE)0x0) {
    return 0x39c3;
  }
  iVar1 = amqpvalue_get_composite_item_count(header->composite_value,&local_14);
  if (iVar1 != 0) {
    return 0x39cb;
  }
  if (((local_14 != 0) &&
      (value = amqpvalue_get_composite_item_in_place(header->composite_value,0),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_boolean(value,durable_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x39e4;
    }
  }
  *durable_value = false;
  return 0;
}

Assistant:

int header_get_durable(HEADER_HANDLE header, bool* durable_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        if (amqpvalue_get_composite_item_count(header_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                *durable_value = false;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(header_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *durable_value = false;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, durable_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *durable_value = false;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}